

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

void __thiscall network_pimpl::remove_event(network_pimpl *this,EventDataType *value)

{
  bool bVar1;
  __type _Var2;
  ostream *poVar3;
  iterator it;
  EventDataType *in_stack_fffffffffffffea8;
  __normal_iterator<EventDataType_*,_std::vector<EventDataType,_std::allocator<EventDataType>_>_>
  *in_stack_fffffffffffffeb0;
  vector<EventDataType,_std::allocator<EventDataType>_> *in_stack_fffffffffffffec0;
  const_iterator in_stack_fffffffffffffec8;
  string *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  __type local_119;
  string local_110 [32];
  string local_f0 [55];
  byte local_b9;
  string local_b8 [39];
  byte local_91;
  string local_90 [48];
  string local_60 [32];
  string local_40 [32];
  EventDataType *local_20;
  __normal_iterator<EventDataType_*,_std::vector<EventDataType,_std::allocator<EventDataType>_>_>
  local_18 [3];
  
  local_18[0]._M_current =
       (EventDataType *)
       std::vector<EventDataType,_std::allocator<EventDataType>_>::begin(in_stack_fffffffffffffea8);
  while( true ) {
    local_20 = (EventDataType *)
               std::vector<EventDataType,_std::allocator<EventDataType>_>::end
                         ((vector<EventDataType,_std::allocator<EventDataType>_> *)
                          in_stack_fffffffffffffea8);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffeb0,
                       (__normal_iterator<EventDataType_*,_std::vector<EventDataType,_std::allocator<EventDataType>_>_>
                        *)in_stack_fffffffffffffea8);
    if (!bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"---could not find event to delete. name: ");
      psVar4 = local_f0;
      EventDataType::getName_abi_cxx11_(in_stack_fffffffffffffea8);
      poVar3 = std::operator<<(poVar3,psVar4);
      poVar3 = std::operator<<(poVar3," origin: ");
      EventDataType::getOrigin_abi_cxx11_(in_stack_fffffffffffffea8);
      poVar3 = std::operator<<(poVar3,local_110);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string(local_110);
      std::__cxx11::string::~string(local_f0);
      return;
    }
    __gnu_cxx::
    __normal_iterator<EventDataType_*,_std::vector<EventDataType,_std::allocator<EventDataType>_>_>
    ::operator->(local_18);
    EventDataType::getName_abi_cxx11_(in_stack_fffffffffffffea8);
    local_91 = 0;
    local_b9 = 0;
    EventDataType::getName_abi_cxx11_(in_stack_fffffffffffffea8);
    _Var2 = std::operator==(in_stack_fffffffffffffed0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffec8._M_current);
    local_119 = false;
    if (_Var2) {
      __gnu_cxx::
      __normal_iterator<EventDataType_*,_std::vector<EventDataType,_std::allocator<EventDataType>_>_>
      ::operator->(local_18);
      EventDataType::getOrigin_abi_cxx11_(in_stack_fffffffffffffea8);
      local_91 = 1;
      EventDataType::getOrigin_abi_cxx11_(in_stack_fffffffffffffea8);
      local_b9 = 1;
      local_119 = std::operator==(in_stack_fffffffffffffed0,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffec8._M_current);
    }
    if ((local_b9 & 1) != 0) {
      std::__cxx11::string::~string(local_b8);
    }
    if ((local_91 & 1) != 0) {
      std::__cxx11::string::~string(local_90);
    }
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_40);
    if (local_119 != false) break;
    __gnu_cxx::
    __normal_iterator<EventDataType_*,_std::vector<EventDataType,_std::allocator<EventDataType>_>_>
    ::operator++(local_18);
  }
  __gnu_cxx::
  __normal_iterator<EventDataType_const*,std::vector<EventDataType,std::allocator<EventDataType>>>::
  __normal_iterator<EventDataType*>
            ((__normal_iterator<const_EventDataType_*,_std::vector<EventDataType,_std::allocator<EventDataType>_>_>
              *)in_stack_fffffffffffffeb0,
             (__normal_iterator<EventDataType_*,_std::vector<EventDataType,_std::allocator<EventDataType>_>_>
              *)in_stack_fffffffffffffea8);
  std::vector<EventDataType,_std::allocator<EventDataType>_>::erase
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffec8);
  return;
}

Assistant:

void network_pimpl::remove_event(const EventDataType &value){
    for(auto it = events.begin(); it != events.end(); ++it){
        if(it->getName() == value.getName() && it->getOrigin() == value.getOrigin()){
            events.erase(it);
            return;
        }
    }
    std::cerr << "---could not find event to delete. name: " << value.getName() << " origin: " << value.getOrigin() << "\n";
}